

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O2

void ggml_opt_result_free(ggml_opt_result_t result)

{
  if (result != (ggml_opt_result_t)0x0) {
    ggml_opt_result::~ggml_opt_result(result);
  }
  operator_delete(result,0x50);
  return;
}

Assistant:

void ggml_opt_result_free(ggml_opt_result_t result) {
    delete result;
}